

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Cast * __thiscall
wasm::ExpressionRunner<wasm::CExpressionRunner>::doCast<wasm::RefTest>
          (Cast *__return_storage_ptr__,ExpressionRunner<wasm::CExpressionRunner> *this,
          RefTest *curr)

{
  bool bVar1;
  ExpressionRunner<wasm::CExpressionRunner> *this_00;
  Literal *other;
  Type *pTVar2;
  Literal local_200;
  Failure local_1e8;
  Literal local_1d0;
  Success local_1b8;
  uintptr_t local_1a0;
  HeapType local_198;
  Literal local_190;
  Failure local_178;
  Literal local_160;
  Success local_148;
  Type local_130;
  Type castType;
  Literal val;
  Flow local_108;
  Breaking local_c0;
  undefined1 local_68 [8];
  Flow ref;
  RefTest *curr_local;
  ExpressionRunner<wasm::CExpressionRunner> *this_local;
  
  ref.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::CExpressionRunner> *)self(this);
  visit((Flow *)local_68,this_00,*(Expression **)(ref.breakTo.super_IString.str._M_str + 0x10));
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(&local_108,(Flow *)local_68);
    Cast::Breaking::Breaking(&local_c0,&local_108);
    Cast::Cast<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Breaking>
              (__return_storage_ptr__,&local_c0);
    Cast::Breaking::~Breaking(&local_c0);
    Flow::~Flow(&local_108);
    val.type.id._4_4_ = 1;
  }
  else {
    other = Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::Literal((Literal *)&castType,other);
    pTVar2 = RefTest::getCastType((RefTest *)ref.breakTo.super_IString.str._M_str);
    local_130.id = pTVar2->id;
    bVar1 = wasm::Literal::isNull((Literal *)&castType);
    if (bVar1) {
      bVar1 = wasm::Type::isNullable(&local_130);
      if (bVar1) {
        wasm::Literal::Literal(&local_160,(Literal *)&castType);
        Cast::Success::Success(&local_148,&local_160);
        Cast::Cast<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success>
                  (__return_storage_ptr__,&local_148);
        Cast::Success::~Success(&local_148);
        wasm::Literal::~Literal(&local_160);
      }
      else {
        wasm::Literal::Literal(&local_190,(Literal *)&castType);
        Cast::Failure::Failure(&local_178,&local_190);
        Cast::Cast<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                  (__return_storage_ptr__,&local_178);
        Cast::Failure::~Failure(&local_178);
        wasm::Literal::~Literal(&local_190);
      }
    }
    else {
      local_198 = wasm::Type::getHeapType((Type *)&val.field_0.func.super_IString.str._M_str);
      local_1a0 = (uintptr_t)wasm::Type::getHeapType(&local_130);
      bVar1 = HeapType::isSubType(local_198,(HeapType)local_1a0);
      if (bVar1) {
        wasm::Literal::Literal(&local_1d0,(Literal *)&castType);
        Cast::Success::Success(&local_1b8,&local_1d0);
        Cast::Cast<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Success>
                  (__return_storage_ptr__,&local_1b8);
        Cast::Success::~Success(&local_1b8);
        wasm::Literal::~Literal(&local_1d0);
      }
      else {
        wasm::Literal::Literal(&local_200,(Literal *)&castType);
        Cast::Failure::Failure(&local_1e8,&local_200);
        Cast::Cast<wasm::ExpressionRunner<wasm::CExpressionRunner>::Cast::Failure>
                  (__return_storage_ptr__,&local_1e8);
        Cast::Failure::~Failure(&local_1e8);
        wasm::Literal::~Literal(&local_200);
      }
    }
    val.type.id._4_4_ = 1;
    wasm::Literal::~Literal((Literal *)&castType);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Cast doCast(T* curr) {
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return typename Cast::Breaking{ref};
    }
    Literal val = ref.getSingleValue();
    Type castType = curr->getCastType();
    if (val.isNull()) {
      if (castType.isNullable()) {
        return typename Cast::Success{val};
      } else {
        return typename Cast::Failure{val};
      }
    }
    if (HeapType::isSubType(val.type.getHeapType(), castType.getHeapType())) {
      return typename Cast::Success{val};
    } else {
      return typename Cast::Failure{val};
    }
  }